

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicTriangleFillNonOverlapCase::
~BasicTriangleFillNonOverlapCase(BasicTriangleFillNonOverlapCase *this)

{
  deInt32 *pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  SharedPtrStateBase *pSVar3;
  pointer pcVar4;
  
  (this->super_BasicVariousTessLevelsPosAttrCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_0219bc30;
  pSVar3 = (this->super_BasicVariousTessLevelsPosAttrCase).m_program.m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar3->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->super_BasicVariousTessLevelsPosAttrCase).m_program.m_ptr = (ShaderProgram *)0x0;
      (*((this->super_BasicVariousTessLevelsPosAttrCase).m_program.m_state)->
        _vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->super_BasicVariousTessLevelsPosAttrCase).m_program.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar3 = (this->super_BasicVariousTessLevelsPosAttrCase).m_program.m_state;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        (*pSVar3->_vptr_SharedPtrStateBase[1])();
      }
      (this->super_BasicVariousTessLevelsPosAttrCase).m_program.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pcVar4 = (this->super_BasicVariousTessLevelsPosAttrCase).m_referenceImagePathPrefix._M_dataplus.
           _M_p;
  paVar2 = &(this->super_BasicVariousTessLevelsPosAttrCase).m_referenceImagePathPrefix.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  tcu::TestCase::~TestCase((TestCase *)this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

BasicTriangleFillNonOverlapCase (Context& context, const char* name, const char* description, TessPrimitiveType primitiveType, SpacingMode spacing, const char* referenceImagePathPrefix)
		: BasicVariousTessLevelsPosAttrCase (context, name, description, primitiveType, spacing, referenceImagePathPrefix)
	{
		DE_ASSERT(primitiveType == TESSPRIMITIVETYPE_TRIANGLES || primitiveType == TESSPRIMITIVETYPE_QUADS);
	}